

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int diff(double *sig,int N,int d,double *oup)

{
  double *C;
  double local_40;
  double sum;
  double *coeff;
  int local_28;
  int j;
  int i;
  int Noup;
  double *oup_local;
  int d_local;
  int N_local;
  double *sig_local;
  
  C = (double *)malloc((long)(d + 1) << 3);
  deld(d,C);
  for (local_28 = d; local_28 < N; local_28 = local_28 + 1) {
    local_40 = 0.0;
    for (coeff._4_4_ = 1; coeff._4_4_ < d + 1; coeff._4_4_ = coeff._4_4_ + 1) {
      local_40 = sig[local_28 - coeff._4_4_] * C[coeff._4_4_] + local_40;
    }
    oup[local_28 - d] = *C * sig[local_28] + local_40;
  }
  free(C);
  return N - d;
}

Assistant:

int diff(double *sig, int N, int d, double *oup) {
	int Noup,i,j;
	double *coeff;
	double sum;
	/*
	 * 
	 * diff output = [ X(t) - X(t-1) ] ^ d where X(t) is the
	 * input timeseries of length N
	 * output is of length N - d
	 * 
	 * diff is used to detrend data
	 * 
	 * d=1 typically takes care of linear trend while
	 * d=2 handles quadratic trend
	 */ 
	
	coeff = (double*) malloc(sizeof(double) * (d+1));
	deld(d,coeff);
	Noup = N - d;
	
	for(i = d; i < N;++i) {
		sum = 0.;
		for(j = 1; j < d+1;++j) {
			sum += sig[i-j]*coeff[j];
		}
		oup[i-d] = sum + coeff[0] * sig[i];
		
	}

	free(coeff);
	
	
	return Noup;
}